

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_helper_ssl.cpp
# Opt level: O2

string * __thiscall
license::CryptoHelperLinux::signString
          (string *__return_storage_ptr__,CryptoHelperLinux *this,string *license)

{
  int iVar1;
  size_t in_RAX;
  EVP_MD_CTX *ctx;
  EVP_MD *type;
  CryptoHelperLinux *sigret;
  logic_error *this_00;
  CryptoHelperLinux *this_01;
  size_t slen;
  
  if (this->m_pktmp == (EVP_PKEY *)0x0) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error
              (this_00,"private key not initialized. Call generate or load first.");
  }
  else {
    slen = in_RAX;
    ctx = (EVP_MD_CTX *)EVP_MD_CTX_new();
    if (ctx == (EVP_MD_CTX *)0x0) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this_00,"Message digest creation context");
    }
    else {
      type = EVP_sha256();
      iVar1 = EVP_DigestSignInit(ctx,(EVP_PKEY_CTX **)0x0,type,(ENGINE *)0x0,
                                 (EVP_PKEY *)this->m_pktmp);
      if (iVar1 != 1) {
        EVP_MD_CTX_free(ctx);
      }
      iVar1 = EVP_DigestSignUpdate(ctx,(license->_M_dataplus)._M_p,license->_M_string_length);
      if (iVar1 == 1) {
        iVar1 = EVP_DigestSignFinal(ctx,(uchar *)0x0,&slen);
        if (iVar1 == 1) {
          sigret = (CryptoHelperLinux *)
                   CRYPTO_malloc((int)slen,
                                 "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]lcc-license-generator/src/base_lib/openssl/crypto_helper_ssl.cpp"
                                 ,0x7e);
          if (sigret == (CryptoHelperLinux *)0x0) {
            EVP_MD_CTX_free(ctx);
            this_00 = (logic_error *)__cxa_allocate_exception(0x10);
            std::logic_error::logic_error(this_00,"Message signature memory allocation exception");
          }
          else {
            this_01 = sigret;
            iVar1 = EVP_DigestSignFinal(ctx,(uchar *)sigret,&slen);
            if (iVar1 == 1) {
              Opensslb64Encode_abi_cxx11_(__return_storage_ptr__,this_01,slen,(uchar *)sigret);
              CRYPTO_free(sigret);
              EVP_MD_CTX_free(ctx);
              return __return_storage_ptr__;
            }
            CRYPTO_free(sigret);
            EVP_MD_CTX_free(ctx);
            this_00 = (logic_error *)__cxa_allocate_exception(0x10);
            std::logic_error::logic_error(this_00,"Message signature exception");
          }
        }
        else {
          EVP_MD_CTX_free(ctx);
          this_00 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(this_00,"Message signature finalization exception");
        }
      }
      else {
        EVP_MD_CTX_free(ctx);
        this_00 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(this_00,"Message signing exception");
      }
    }
  }
  __cxa_throw(this_00,std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

const string CryptoHelperLinux::signString(const string &license) const {
	if (!m_pktmp) {
		throw logic_error("private key not initialized. Call generate or load first.");
	}

	size_t slen;
	unsigned char *signature = nullptr;
	/* Create the Message Digest Context */
	EVP_MD_CTX *mdctx = EVP_MD_CTX_create();
	if (!mdctx) {
		throw logic_error("Message digest creation context");
	}

	/*Initialise the DigestSign operation - SHA-256 has been selected
	 * as the message digest function */
	if (1 != EVP_DigestSignInit(mdctx, NULL, EVP_sha256(), NULL, m_pktmp)) {
		EVP_MD_CTX_destroy(mdctx);
	}
	/* Call update with the message */
	if (EVP_DigestSignUpdate(mdctx, (const void *)license.c_str(), (size_t)license.length()) != 1) {
		EVP_MD_CTX_destroy(mdctx);
		throw logic_error("Message signing exception");
	}
	/* Finalise the DigestSign operation */
	/* First call EVP_DigestSignFinal with a NULL sig parameter to obtain the length of the
	 * signature. Length is returned in slen */
	if (EVP_DigestSignFinal(mdctx, NULL, &slen) != 1) {
		EVP_MD_CTX_destroy(mdctx);
		throw logic_error("Message signature finalization exception");
	}
	/* Allocate memory for the signature based on size in slen */
	if (!(signature = (unsigned char *)OPENSSL_malloc(sizeof(unsigned char) * slen))) {
		EVP_MD_CTX_destroy(mdctx);
		throw logic_error("Message signature memory allocation exception");
	}
	/* Obtain the signature */
	if (1 != EVP_DigestSignFinal(mdctx, signature, &slen)) {
		OPENSSL_free(signature);
		EVP_MD_CTX_destroy(mdctx);
		throw logic_error("Message signature exception");
	}

	string signatureStr = Opensslb64Encode(slen, signature);

	if (signature) OPENSSL_free(signature);
	EVP_MD_CTX_destroy(mdctx);
	return signatureStr;
}